

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O0

WirehairResult __thiscall
wirehair::Codec::DecodeFeed(Codec *this,uint32_t block_id,void *block_in,uint block_bytes)

{
  uint uVar1;
  bool bVar2;
  uint8_t *__dest;
  uint in_ECX;
  void *in_RDX;
  uint in_ESI;
  Codec *in_RDI;
  bool bVar3;
  WirehairResult result;
  uint32_t final_bytes_1;
  uint8_t *dest;
  WirehairResult result_1;
  uint16_t row_i;
  uint32_t final_bytes;
  bool isFinalBlock;
  void *in_stack_000000e0;
  uint in_stack_000000ec;
  Codec *in_stack_000000f0;
  Codec *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffd0;
  ushort uVar4;
  uint in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffe8;
  WirehairResult local_4;
  
  if (in_RDX == (void *)0x0) {
    local_4 = Wirehair_InvalidInput;
  }
  else {
    bVar3 = in_ESI + 1 != (uint)in_RDI->_block_count;
    if (bVar3) {
      if (in_RDI->_block_bytes != in_ECX) {
        return Wirehair_InvalidInput;
      }
    }
    else {
      in_stack_ffffffffffffffd4 = in_RDI->_output_final_bytes;
      if (in_ECX < in_stack_ffffffffffffffd4) {
        return Wirehair_InvalidInput;
      }
    }
    if (in_RDI->_block_count <= in_ESI) {
      in_RDI->_all_original = false;
    }
    uVar4 = in_RDI->_row_count;
    if (uVar4 < in_RDI->_block_count) {
      bVar2 = OpportunisticPeeling(in_RDI,(uint16_t)(in_ESI >> 0x10),in_stack_ffffffffffffffe8);
      if (bVar2) {
        __dest = in_RDI->_input_blocks + in_RDI->_block_bytes * (uint)uVar4;
        if (bVar3) {
          memcpy(__dest,in_RDX,(ulong)in_RDI->_block_bytes);
        }
        else {
          uVar1 = in_RDI->_output_final_bytes;
          memcpy(__dest,in_RDX,(ulong)uVar1);
          memset(__dest + uVar1,0,(ulong)(in_RDI->_block_bytes - uVar1));
        }
        in_RDI->_row_count = in_RDI->_row_count + 1;
        if (in_RDI->_row_count == in_RDI->_block_count) {
          if ((in_RDI->_all_original & 1U) == 0) {
            local_4 = SolveMatrix(in_stack_ffffffffffffffa8);
            if (local_4 == Wirehair_Success) {
              GenerateRecoveryBlocks(in_RDI);
            }
          }
          else {
            bVar3 = IsAllOriginalData((Codec *)CONCAT44(in_stack_ffffffffffffffd4,
                                                        CONCAT22(uVar4,in_stack_ffffffffffffffd0)));
            if (bVar3) {
              local_4 = Wirehair_Success;
            }
            else {
              in_RDI->_all_original = false;
              local_4 = Wirehair_InvalidInput;
            }
          }
        }
        else {
          local_4 = Wirehair_NeedMore;
        }
      }
      else {
        local_4 = Wirehair_NeedMore;
      }
    }
    else {
      local_4 = ResumeSolveMatrix(in_stack_000000f0,in_stack_000000ec,in_stack_000000e0);
      if (local_4 == Wirehair_Success) {
        GenerateRecoveryBlocks(in_RDI);
      }
    }
  }
  return local_4;
}

Assistant:

WirehairResult Codec::DecodeFeed(
    const uint32_t block_id,
    const void * GF256_RESTRICT block_in,
    const unsigned block_bytes)
{
    // Validate input
    if (!block_in) {
        return Wirehair_InvalidInput;
    }

    const bool isFinalBlock = ((block_id + 1) == (uint32_t)_block_count);

    // If this is the last block:
    if (isFinalBlock) {
        // Decoder uses _output_final_bytes to store partial bytes
        const uint32_t final_bytes = _output_final_bytes;

        // If the application did not provide enough bytes:
        if (final_bytes > block_bytes) {
            return Wirehair_InvalidInput;
        }
    }
    else {
        // If the application did not provide the right number of bytes:
        if (_block_bytes != block_bytes) {
            return Wirehair_InvalidInput;
        }
    }

#if defined(CAT_ALL_ORIGINAL)
    // If provided a block of non-original data, mark all original as false
    if (block_id >= _block_count) {
        _all_original = false;
    }
#endif

    const uint16_t row_i = _row_count;

    // If at least N rows stored:
    if (row_i >= _block_count)
    {
        // Resume GE from this row
        const WirehairResult result = ResumeSolveMatrix(block_id, block_in);

        if (result == Wirehair_Success) {
            GenerateRecoveryBlocks();
        }

        return result;
    }

    // If opportunistic peeling failed for this row:
    if (!OpportunisticPeeling(row_i, block_id))
    {
        // This means that there was not enough room in the sparse matrix
        // data structure to store the data in this row.  We will need to
        // wait for another row that references different columns in
        // order to continue
        return Wirehair_NeedMore;
    }

    uint8_t * GF256_RESTRICT dest = _input_blocks + _block_bytes * row_i;

    // If this is the last block id:
    if (isFinalBlock)
    {
        const uint32_t final_bytes = _output_final_bytes;

        // Copy the new row data into the input block area
        memcpy(dest, block_in, final_bytes);

        // Pad with zeros
        memset(dest + final_bytes, 0, _block_bytes - final_bytes);
    }
    else
    {
        // Copy the new row data into the input block area
        memcpy(dest, block_in, _block_bytes);
    }

    ++_row_count;
    CAT_DEBUG_ASSERT(_row_count <= _block_count);

    // If not enough blocks yet:
    if (_row_count != _block_count) {
        return Wirehair_NeedMore;
    }

#if defined(CAT_ALL_ORIGINAL)
    // If all original data, return success (common case)
    if (_all_original) {
        // Check input:
        if (!IsAllOriginalData()) {
            // Application violated precondition that all inputs must be unique
            CAT_DEBUG_BREAK();
            _all_original = false;
            return Wirehair_InvalidInput;
        }
        return Wirehair_Success;
    }
#endif

    // Attempt to solve the matrix
    const WirehairResult result = SolveMatrix();

    // If solve was successful (common):
    if (result == Wirehair_Success) {
        GenerateRecoveryBlocks();
    }

    return result;
}